

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImplX11.cpp
# Opt level: O1

bool __thiscall
sf::priv::WindowImplX11::checkXRandR(WindowImplX11 *this,int *xRandRMajor,int *xRandRMinor)

{
  int iVar1;
  ostream *poVar2;
  long lVar3;
  char *pcVar4;
  int version;
  undefined1 local_1c [4];
  
  iVar1 = XQueryExtension(this->m_display,"RANDR",local_1c,local_1c,local_1c);
  if (iVar1 == 0) {
    poVar2 = err();
    pcVar4 = "XRandR extension is not supported";
    lVar3 = 0x21;
  }
  else {
    iVar1 = XRRQueryVersion(this->m_display,xRandRMajor,xRandRMinor);
    if ((iVar1 != 0) && (0 < *xRandRMajor)) {
      if (*xRandRMajor != 1) {
        return true;
      }
      if (1 < *xRandRMinor) {
        return true;
      }
    }
    poVar2 = err();
    pcVar4 = "XRandR is too old";
    lVar3 = 0x11;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar4,lVar3);
  std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return false;
}

Assistant:

bool WindowImplX11::checkXRandR(int& xRandRMajor, int& xRandRMinor)
{
    // Check if the XRandR extension is present
    int version;
    if (!XQueryExtension(m_display, "RANDR", &version, &version, &version))
    {
        err() << "XRandR extension is not supported" << std::endl;
        return false;
    }

    // Check XRandR version, 1.2 required
    if (!XRRQueryVersion(m_display, &xRandRMajor, &xRandRMinor) || xRandRMajor < 1 || (xRandRMajor == 1 && xRandRMinor < 2 ))
    {
        err() << "XRandR is too old" << std::endl;
        return false;
    }

    return true;
}